

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O1

void UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  ushort *puVar1;
  byte bVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uint32_t uVar7;
  UConverter *pUVar8;
  byte *pbVar9;
  ushort *puVar10;
  UChar *pUVar11;
  UChar *pUVar12;
  int32_t *piVar13;
  bool bVar14;
  UChar *pUVar15;
  UConverter *pUVar16;
  byte *pbVar17;
  char cVar18;
  long lVar19;
  UChar UVar20;
  uint uVar21;
  byte *pbVar22;
  int *piVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  short sVar27;
  byte bVar28;
  long lVar29;
  bool bVar30;
  ulong local_40;
  
  pUVar8 = args->converter;
  if (pUVar8 == (UConverter *)0x0) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    pbVar9 = (byte *)args->sourceLimit;
    pbVar17 = (byte *)args->source;
    pUVar15 = args->target;
    puVar10 = (ushort *)pUVar8->extraInfo;
    bVar30 = *err < U_ILLEGAL_ARGUMENT_ERROR;
    if (pbVar17 < pbVar9 && bVar30) {
      pUVar11 = args->targetLimit;
      pbVar22 = pbVar17;
      do {
        lVar19 = 0;
        while( true ) {
          if (pUVar11 <= pUVar15) {
            *err = U_BUFFER_OVERFLOW_ERROR;
            pbVar17 = pbVar22;
            goto LAB_0034493b;
          }
          pbVar17 = pbVar22 + lVar19 + 1;
          bVar2 = pbVar22[lVar19];
          uVar4 = *puVar10;
          uVar21 = (uint)bVar2;
          if (uVar4 != 0xef) break;
          if ((byte)(bVar2 + 0xbe) < 10) {
            puVar10[4] = (ushort)((int)lookupTable[uVar21 & 0xf] << 7);
            uVar21 = (uint)lookupTable[uVar21 & 0xf][1];
LAB_00343c05:
            *(uint *)(puVar10 + 8) = uVar21;
          }
          else {
            if (bVar2 == 0x40) {
              puVar10[4] = puVar10[2];
              uVar21 = *(uint *)(puVar10 + 10);
              goto LAB_00343c05;
            }
            if (0x1e < (byte)(bVar2 - 0x21)) {
              *err = U_ILLEGAL_CHAR_FOUND;
              *puVar10 = 0xfffe;
              goto LAB_00344a68;
            }
          }
          *puVar10 = 0xfffe;
          lVar19 = lVar19 + 1;
          if (!(bool)(bVar30 & pbVar17 < pbVar9)) goto LAB_0034493b;
        }
        iVar24 = (int)pbVar22;
        iVar25 = (int)lVar19;
        if (uVar4 != 0xd9) {
          if (uVar4 != 0xf0) {
            local_40 = 0xffff;
            goto LAB_00343e0b;
          }
          if ((byte)(bVar2 + 0x5f) < 0x4e) {
            if ((uVar21 == 0xbf) || (uVar21 == 0xb8)) {
              sVar27 = 0x952;
              if (bVar2 == 0xbf) {
                sVar27 = 0x970;
              }
              pbVar22 = (uint8_t *)0x3e9d12;
              if (bVar2 == 0xbf) {
                pbVar22 = (uint8_t *)0x3e9d30;
              }
              if ((*(uint *)(puVar10 + 8) & (uint)*pbVar22) == 0) goto LAB_00344a4a;
              *puVar10 = 0xfffe;
              if (*(int *)(puVar10 + 0x16) != 0) {
                UVar20 = (UChar)*(int *)(puVar10 + 0x16);
                if (pUVar15 < args->targetLimit) {
                  *pUVar15 = UVar20;
                  pUVar15 = pUVar15 + 1;
                  piVar23 = args->offsets;
                  if (piVar23 != (int *)0x0) {
                    args->offsets = piVar23 + 1;
                    *piVar23 = (iVar24 - *(int *)&args->source) + iVar25;
                  }
                }
                else {
                  pUVar16 = args->converter;
                  cVar18 = pUVar16->UCharErrorBufferLength;
                  pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                  pUVar16->UCharErrorBuffer[cVar18] = UVar20;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                puVar10[0x16] = 0;
                puVar10[0x17] = 0;
              }
              uVar4 = puVar10[4];
              if (pUVar15 < args->targetLimit) {
                *pUVar15 = sVar27 + uVar4;
                pUVar15 = pUVar15 + 1;
                piVar23 = args->offsets;
                if (piVar23 != (int *)0x0) {
                  args->offsets = piVar23 + 1;
                  *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
                }
              }
              else {
                pUVar16 = args->converter;
                cVar18 = pUVar16->UCharErrorBufferLength;
                pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                pUVar16->UCharErrorBuffer[cVar18] = sVar27 + uVar4;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
              goto LAB_003445a3;
            }
            goto LAB_00344a4a;
          }
          *puVar10 = 0xfffe;
          *err = U_ILLEGAL_CHAR_FOUND;
LAB_00344a68:
          args->converter->toUBytes[0] = bVar2;
          args->converter->toULength = '\x01';
          break;
        }
        local_40 = 0x200d;
        if (bVar2 == 0xe8) {
          local_40 = 0x20;
        }
        if (*(int *)(puVar10 + 0x16) != 0) {
          UVar20 = (UChar)*(int *)(puVar10 + 0x16);
          if (pUVar15 < args->targetLimit) {
            *pUVar15 = UVar20;
            pUVar15 = pUVar15 + 1;
            piVar13 = args->offsets;
            if (piVar13 != (int32_t *)0x0) {
              args->offsets = piVar13 + 1;
              *piVar13 = iVar25 + (iVar24 - *(int *)&args->source);
            }
          }
          else {
            pUVar16 = args->converter;
            cVar18 = pUVar16->UCharErrorBufferLength;
            pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
            pUVar16->UCharErrorBuffer[cVar18] = UVar20;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          puVar10[0x16] = 0;
          puVar10[0x17] = 0;
        }
        if (pUVar15 < args->targetLimit) {
          *pUVar15 = (UChar)local_40;
          pUVar15 = pUVar15 + 1;
          piVar23 = args->offsets;
          if (piVar23 != (int *)0x0) {
            args->offsets = piVar23 + 1;
            *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
          }
        }
        else {
          pUVar16 = args->converter;
          cVar18 = pUVar16->UCharErrorBufferLength;
          pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
          pUVar16->UCharErrorBuffer[cVar18] = (UChar)local_40;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        *puVar10 = 0xfffe;
LAB_00343e0b:
        if (uVar21 < 0xe0) {
          if ((uVar21 == 10) || (uVar21 == 0xd)) {
            *(char *)((long)puVar10 + 0x19) = '\x01';
          }
          else if (uVar21 == 0xd9) goto switchD_00343e38_caseD_ef;
switchD_00343e38_caseD_eb:
          local_40._0_4_ = (uint32_t)toUnicodeTable[bVar2];
          if (0xa0 < bVar2) {
LAB_00344197:
            if ((*(uint *)(puVar10 + 8) & (uint)""[(uint32_t)local_40 & 0x7f]) == 0) {
              if (bVar2 != 0xd0) {
                local_40._0_4_ = 0xffff;
              }
              if (puVar10[4] != 0x300) {
                local_40._0_4_ = 0xffff;
              }
            }
          }
          *puVar10 = (ushort)bVar2;
          goto LAB_003441ca;
        }
        switch(bVar2) {
        case 0xe8:
          if (*puVar10 == 0xe8) {
            *puVar10 = 0xfffe;
            local_40._0_4_ = 0x200c;
            break;
          }
LAB_0034418b:
          local_40._0_4_ = (uint32_t)toUnicodeTable[bVar2];
          goto LAB_00344197;
        case 0xe9:
          uVar4 = *puVar10;
          if (uVar4 == 0xe8) {
            *puVar10 = 0xfffe;
            local_40._0_4_ = 0x200d;
          }
          else {
            uVar5 = puVar10[4];
            if (uVar4 == 0xc0 && uVar5 == 0x100) {
              if (*(int *)(puVar10 + 0x16) != 0) {
                UVar20 = (UChar)*(int *)(puVar10 + 0x16);
                if (pUVar15 < args->targetLimit) {
                  *pUVar15 = UVar20;
                  pUVar15 = pUVar15 + 1;
                  piVar23 = args->offsets;
                  if (piVar23 != (int *)0x0) {
                    args->offsets = piVar23 + 1;
                    *piVar23 = (iVar24 - *(int *)&args->source) + iVar25;
                  }
                }
                else {
                  pUVar16 = args->converter;
                  cVar18 = pUVar16->UCharErrorBufferLength;
                  pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                  pUVar16->UCharErrorBuffer[cVar18] = UVar20;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                puVar10[0x16] = 0;
                puVar10[0x17] = 0;
              }
              pUVar12 = args->targetLimit;
              if (pUVar15 < pUVar12) {
                *pUVar15 = L'ੜ';
                pUVar15 = pUVar15 + 1;
                piVar23 = args->offsets;
                if (piVar23 != (int *)0x0) {
                  args->offsets = piVar23 + 1;
                  *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
                }
              }
              else {
                pUVar16 = args->converter;
                cVar18 = pUVar16->UCharErrorBufferLength;
                pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                pUVar16->UCharErrorBuffer[cVar18] = L'ੜ';
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
              if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
                if (pUVar15 < pUVar12) {
                  *pUVar15 = L'੍';
                  pUVar15 = pUVar15 + 1;
                  piVar23 = args->offsets;
                  if (piVar23 != (int *)0x0) {
                    args->offsets = piVar23 + 1;
                    *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
                  }
                }
                else {
                  pUVar16 = args->converter;
                  cVar18 = pUVar16->UCharErrorBufferLength;
                  pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                  pUVar16->UCharErrorBuffer[cVar18] = L'੍';
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                if (U_ZERO_ERROR < *err) {
                  pUVar16 = args->converter;
                  cVar18 = pUVar16->UCharErrorBufferLength;
                  pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                  goto LAB_003447e5;
                }
                if (pUVar15 < pUVar12) {
                  *pUVar15 = L'ਹ';
                  pUVar15 = pUVar15 + 1;
                  piVar23 = args->offsets;
                  if (piVar23 != (int *)0x0) {
                    args->offsets = piVar23 + 1;
                    *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
                  }
                }
                else {
                  pUVar16 = args->converter;
                  cVar18 = pUVar16->UCharErrorBufferLength;
                  pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                  pUVar16->UCharErrorBuffer[cVar18] = L'ਹ';
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
              }
              else {
                pUVar16 = args->converter;
                cVar3 = pUVar16->UCharErrorBufferLength;
                cVar18 = cVar3 + '\x01';
                pUVar16->UCharErrorBufferLength = cVar18;
                pUVar16->UCharErrorBuffer[cVar3] = L'੍';
                pUVar16->UCharErrorBufferLength = cVar3 + '\x02';
LAB_003447e5:
                pUVar16->UCharErrorBuffer[cVar18] = L'ਹ';
              }
              pUVar8->toUnicodeStatus = 0xffff;
              *puVar10 = 0xfffe;
              goto LAB_003445a3;
            }
            if ((char)uVar4 == -0x5a) {
              bVar30 = false;
              lVar29 = 0x3e9c84;
            }
            else {
              uVar26 = 0;
              lVar19 = 0x3e9c84;
              do {
                if (uVar26 == 0xe) {
                  bVar30 = true;
                  goto LAB_00344715;
                }
                lVar29 = lVar19 + 4;
                uVar26 = uVar26 + 1;
                puVar1 = (ushort *)(lVar19 + 4);
                lVar19 = lVar29;
              } while (*puVar1 != (uVar4 & 0xff));
              bVar30 = 0xe < uVar26;
            }
            local_40 = (ulong)*(ushort *)(lVar29 + 2);
LAB_00344715:
            if ((bVar30) || ((*(uint *)(puVar10 + 8) & (uint)""[local_40 & 0xff]) == 0))
            goto switchD_00343e38_caseD_eb;
            *puVar10 = 0xfffe;
            pUVar8->toUnicodeStatus = 0xffff;
            if (uVar5 == 0x100) {
              if (*(int *)(puVar10 + 0x16) != 0) {
                UVar20 = (UChar)*(int *)(puVar10 + 0x16);
                if (pUVar15 < args->targetLimit) {
                  *pUVar15 = UVar20;
                  pUVar15 = pUVar15 + 1;
                  piVar23 = args->offsets;
                  if (piVar23 != (int *)0x0) {
                    args->offsets = piVar23 + 1;
                    *piVar23 = (iVar24 - *(int *)&args->source) + iVar25;
                  }
                }
                else {
                  pUVar16 = args->converter;
                  cVar18 = pUVar16->UCharErrorBufferLength;
                  pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                  pUVar16->UCharErrorBuffer[cVar18] = UVar20;
                  *err = U_BUFFER_OVERFLOW_ERROR;
                }
                puVar10[0x16] = 0;
                puVar10[0x17] = 0;
              }
              if (((0xa0 < (uint32_t)local_40) && (1 < (uint32_t)local_40 - 0x964)) &&
                 (1 < (uint32_t)local_40 - 0x200c)) {
                local_40 = (ulong)((uint32_t)local_40 + 0x100);
              }
              if (pUVar15 < args->targetLimit) {
                *pUVar15 = (UChar)local_40;
                pUVar15 = pUVar15 + 1;
                piVar23 = args->offsets;
                if (piVar23 != (int *)0x0) {
                  args->offsets = piVar23 + 1;
                  *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
                }
              }
              else {
                pUVar16 = args->converter;
                cVar18 = pUVar16->UCharErrorBufferLength;
                pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                pUVar16->UCharErrorBuffer[cVar18] = (UChar)local_40;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
              goto LAB_003445a3;
            }
          }
          break;
        case 0xea:
          if (*puVar10 != 0xea) goto LAB_0034418b;
          *puVar10 = 0xfffe;
          pUVar8->toUnicodeStatus = 0xffff;
          local_40._0_4_ = 0x965;
          break;
        case 0xeb:
        case 0xec:
        case 0xed:
        case 0xee:
          goto switchD_00343e38_caseD_eb;
        case 0xef:
        case 0xf0:
switchD_00343e38_caseD_ef:
          *puVar10 = (ushort)bVar2;
          if (pUVar8->toUnicodeStatus != 0xffff) {
            if (*(int *)(puVar10 + 0x16) != 0) {
              UVar20 = (UChar)*(int *)(puVar10 + 0x16);
              if (pUVar15 < args->targetLimit) {
                *pUVar15 = UVar20;
                pUVar15 = pUVar15 + 1;
                piVar23 = args->offsets;
                if (piVar23 != (int *)0x0) {
                  args->offsets = piVar23 + 1;
                  *piVar23 = (iVar24 - *(int *)&args->source) + iVar25;
                }
              }
              else {
                pUVar16 = args->converter;
                cVar18 = pUVar16->UCharErrorBufferLength;
                pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                pUVar16->UCharErrorBuffer[cVar18] = UVar20;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
              puVar10[0x16] = 0;
              puVar10[0x17] = 0;
            }
            uVar7 = pUVar8->toUnicodeStatus;
            if (((0xa0 < (int)uVar7) && (1 < uVar7 - 0x964)) && (1 < uVar7 - 0x200c)) {
              pUVar8->toUnicodeStatus = uVar7 + puVar10[4];
            }
            UVar20 = (UChar)pUVar8->toUnicodeStatus;
            if (pUVar15 < args->targetLimit) {
              *pUVar15 = UVar20;
              pUVar15 = pUVar15 + 1;
              piVar23 = args->offsets;
              if (piVar23 != (int *)0x0) {
                args->offsets = piVar23 + 1;
                *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
              }
            }
            else {
              pUVar16 = args->converter;
              cVar18 = pUVar16->UCharErrorBufferLength;
              pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
              pUVar16->UCharErrorBuffer[cVar18] = UVar20;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            goto LAB_00344501;
          }
          goto LAB_003445a3;
        default:
          if (uVar21 != 0xe0) goto switchD_00343e38_caseD_eb;
          bVar30 = true;
          do {
            bVar14 = bVar30;
            if (!bVar14) goto LAB_0034415f;
            bVar30 = false;
          } while ((char)*puVar10 != -0x5c);
          local_40 = 0x904;
LAB_0034415f:
          if ((!bVar14) || ((*(uint *)(puVar10 + 8) & (uint)""[local_40 & 0xff]) == 0))
          goto LAB_0034418b;
          *puVar10 = 0xfffe;
          pUVar8->toUnicodeStatus = 0xffff;
        }
LAB_003441ca:
        if (pUVar8->toUnicodeStatus == 0xffff) {
LAB_00344569:
          if ((uint32_t)local_40 == 0xffff) {
LAB_00344a4a:
            *err = U_INVALID_CHAR_FOUND;
            goto LAB_00344a68;
          }
          pUVar8->toUnicodeStatus = (uint32_t)local_40;
          if (*(char *)((long)puVar10 + 0x19) == '\x01') {
            puVar10[4] = puVar10[2];
            *(undefined4 *)(puVar10 + 8) = *(undefined4 *)(puVar10 + 10);
            *(char *)((long)puVar10 + 0x19) = '\0';
          }
        }
        else {
          uVar4 = puVar10[4];
          if ((uVar4 != 0x100) || (iVar6 = *(int *)(puVar10 + 0x16), iVar6 == 0)) {
LAB_0034428b:
            if (*(int *)(puVar10 + 0x16) != 0) {
              UVar20 = (UChar)*(int *)(puVar10 + 0x16);
              if (pUVar15 < args->targetLimit) {
                *pUVar15 = UVar20;
                pUVar15 = pUVar15 + 1;
                piVar23 = args->offsets;
                if (piVar23 != (int *)0x0) {
                  args->offsets = piVar23 + 1;
                  *piVar23 = (iVar24 - *(int *)&args->source) + iVar25;
                }
              }
              else {
                pUVar16 = args->converter;
                cVar18 = pUVar16->UCharErrorBufferLength;
                pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                pUVar16->UCharErrorBuffer[cVar18] = UVar20;
                *err = U_BUFFER_OVERFLOW_ERROR;
              }
              puVar10[0x16] = 0;
              puVar10[0x17] = 0;
            }
            if (((uVar4 == 0x100) && ((uint32_t)local_40 == 0x902)) &&
               ((uVar7 = pUVar8->toUnicodeStatus, 0xffffffaf < uVar7 - 0x950 &&
                (1 < ""[uVar7 - 0x900])))) {
              if (((0xa0 < (int)uVar7) && (1 < uVar7 - 0x964)) && (1 < uVar7 - 0x200c)) {
                pUVar8->toUnicodeStatus = uVar7 + 0x100;
              }
              UVar20 = (UChar)pUVar8->toUnicodeStatus;
              if (pUVar15 < args->targetLimit) {
                *pUVar15 = UVar20;
                piVar23 = args->offsets;
                local_40._0_4_ = 0x970;
LAB_003443cb:
                pUVar15 = pUVar15 + 1;
                if (piVar23 != (int *)0x0) {
                  args->offsets = piVar23 + 1;
                  *piVar23 = (iVar24 - *(int *)&args->source) + iVar25 + -1;
                }
              }
              else {
                pUVar16 = args->converter;
                cVar18 = pUVar16->UCharErrorBufferLength;
                pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
                pUVar16->UCharErrorBuffer[cVar18] = UVar20;
                *err = U_BUFFER_OVERFLOW_ERROR;
                local_40._0_4_ = 0x970;
              }
            }
            else if ((((uVar4 == 0x100) && ((uint32_t)local_40 == 0x94d)) &&
                     (uVar7 = pUVar8->toUnicodeStatus, 0xffffffaf < uVar7 - 0x950)) &&
                    ((""[uVar7 - 0x900] & 1) != 0)) {
              *(uint32_t *)(puVar10 + 0x16) = uVar7 + 0x100;
            }
            else {
              uVar7 = pUVar8->toUnicodeStatus;
              if (((0xa0 < (int)uVar7) && (1 < uVar7 - 0x964)) && (1 < uVar7 - 0x200c)) {
                pUVar8->toUnicodeStatus = uVar7 + uVar4;
              }
              UVar20 = (UChar)pUVar8->toUnicodeStatus;
              if (pUVar15 < args->targetLimit) {
                *pUVar15 = UVar20;
                piVar23 = args->offsets;
                goto LAB_003443cb;
              }
              pUVar16 = args->converter;
              cVar18 = pUVar16->UCharErrorBufferLength;
              pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
              pUVar16->UCharErrorBuffer[cVar18] = UVar20;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            pUVar8->toUnicodeStatus = 0xffff;
            goto LAB_00344569;
          }
          if (iVar6 - 0xa50U < 0xffffffb0) {
            bVar28 = 0;
          }
          else {
            bVar28 = ""[iVar6 - 0xa00] & 1;
          }
          if (((pUVar8->toUnicodeStatus != 0x94d) || (bVar28 == 0)) ||
             ((uint32_t)local_40 + 0x100 != iVar6)) goto LAB_0034428b;
          iVar25 = (iVar24 + -2 + iVar25) - *(int *)&args->source;
          pUVar12 = args->targetLimit;
          if (pUVar15 < pUVar12) {
            *pUVar15 = L'ੱ';
            pUVar15 = pUVar15 + 1;
            piVar13 = args->offsets;
            if (piVar13 != (int32_t *)0x0) {
              args->offsets = piVar13 + 1;
              *piVar13 = iVar25;
            }
          }
          else {
            pUVar16 = args->converter;
            cVar18 = pUVar16->UCharErrorBufferLength;
            pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
            pUVar16->UCharErrorBuffer[cVar18] = L'ੱ';
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          UVar20 = puVar10[0x16];
          if (pUVar15 < pUVar12) {
            *pUVar15 = UVar20;
            pUVar15 = pUVar15 + 1;
            piVar13 = args->offsets;
            if (piVar13 != (int32_t *)0x0) {
              args->offsets = piVar13 + 1;
              *piVar13 = iVar25;
            }
          }
          else {
            pUVar16 = args->converter;
            cVar18 = pUVar16->UCharErrorBufferLength;
            pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
            pUVar16->UCharErrorBuffer[cVar18] = UVar20;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          puVar10[0x16] = 0;
          puVar10[0x17] = 0;
LAB_00344501:
          pUVar8->toUnicodeStatus = 0xffff;
        }
LAB_003445a3:
        bVar30 = *err < U_ILLEGAL_ARGUMENT_ERROR;
        if ((U_ZERO_ERROR < *err) || (pbVar22 = pbVar17, pbVar9 <= pbVar17)) break;
      } while( true );
    }
LAB_0034493b:
    if (((*err < U_ILLEGAL_ARGUMENT_ERROR) && (args->flush != '\0')) && (pbVar17 == pbVar9)) {
      pUVar16 = args->converter;
      uVar21 = *puVar10 - 0xd9;
      if ((uVar21 < 0x18) && ((0xc00001U >> (uVar21 & 0x1f) & 1) != 0)) {
        pUVar16->toUBytes[0] = (uint8_t)*puVar10;
        pUVar16->toULength = '\x01';
        *puVar10 = 0xfffe;
      }
      else {
        pUVar16->toULength = '\0';
      }
      uVar7 = pUVar8->toUnicodeStatus;
      if (uVar7 != 0xffff) {
        if (((0xa0 < (int)uVar7) && (1 < uVar7 - 0x964)) && (1 < uVar7 - 0x200c)) {
          pUVar8->toUnicodeStatus = uVar7 + puVar10[4];
        }
        UVar20 = (UChar)pUVar8->toUnicodeStatus;
        if (pUVar15 < args->targetLimit) {
          *pUVar15 = UVar20;
          pUVar15 = pUVar15 + 1;
          piVar23 = args->offsets;
          if (piVar23 != (int *)0x0) {
            args->offsets = piVar23 + 1;
            *piVar23 = ~*(uint *)&args->source + (int)pbVar17;
          }
        }
        else {
          pUVar16 = args->converter;
          cVar18 = pUVar16->UCharErrorBufferLength;
          pUVar16->UCharErrorBufferLength = cVar18 + '\x01';
          pUVar16->UCharErrorBuffer[cVar18] = UVar20;
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        pUVar8->toUnicodeStatus = 0xffff;
      }
    }
    args->target = pUVar15;
    args->source = (char *)pbVar17;
  }
  return;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args, UErrorCode* err) {
    const char *source = ( char *) args->source;
    UChar *target = args->target;
    const char *sourceLimit = args->sourceLimit;
    const UChar* targetLimit = args->targetLimit;
    uint32_t targetUniChar = 0x0000;
    uint8_t sourceChar = 0x0000;
    UConverterDataISCII* data;
    UChar32* toUnicodeStatus=NULL;
    UChar32 tempTargetUniChar = 0x0000;
    UChar* contextCharToUnicode= NULL;
    UBool found;
    int i; 
    int offset = 0;

    if ((args->converter == NULL) || (target < args->target) || (source < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    data = (UConverterDataISCII*)(args->converter->extraInfo);
    contextCharToUnicode = &data->contextCharToUnicode; /* contains previous ISCII codepoint visited */
    toUnicodeStatus = (UChar32*)&args->converter->toUnicodeStatus;/* contains the mapping to Unicode of the above codepoint*/

    while (U_SUCCESS(*err) && source<sourceLimit) {

        targetUniChar = missingCharMarker;

        if (target < targetLimit) {
            sourceChar = (unsigned char)*(source)++;

            /* look at the post-context preform special processing */
            if (*contextCharToUnicode==ATR) {

                /* If we have ATR in *contextCharToUnicode then we need to change our
                 * state to the Indic Script specified by sourceChar
                 */

                /* check if the sourceChar is supported script range*/
                if ((uint8_t)(PNJ-sourceChar)<=PNJ-DEV) {
                    data->currentDeltaToUnicode = (uint16_t)(lookupTable[sourceChar & 0x0F][0] * DELTA);
                    data->currentMaskToUnicode = (MaskEnum)lookupTable[sourceChar & 0x0F][1];
                } else if (sourceChar==DEF) {
                    /* switch back to default */
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                } else {
                    if ((sourceChar >= 0x21 && sourceChar <= 0x3F)) {
                        /* these are display codes consume and continue */
                    } else {
                        *err =U_ILLEGAL_CHAR_FOUND;
                        /* reset */
                        *contextCharToUnicode=NO_CHAR_MARKER;
                        goto CALLBACK;
                    }
                }

                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;

                continue;

            } else if (*contextCharToUnicode==EXT) {
                /* check if sourceChar is in 0xA1-0xEE range */
                if ((uint8_t) (EXT_RANGE_END - sourceChar) <= (EXT_RANGE_END - EXT_RANGE_BEGIN)) {
                    /* We currently support only Anudatta and Devanagari abbreviation sign */
                    if (sourceChar==0xBF || sourceChar == 0xB8) {
                        targetUniChar = (sourceChar==0xBF) ? DEV_ABBR_SIGN : DEV_ANUDATTA;
                        
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            *contextCharToUnicode= NO_CHAR_MARKER;

                            /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                            if (data->prevToUnicodeStatus) {
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                data->prevToUnicodeStatus = 0x0000;
                            }
                            /* write to target */
                            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);

                            continue;
                        }
                    }
                    /* byte unit is unassigned */
                    targetUniChar = missingCharMarker;
                    *err= U_INVALID_CHAR_FOUND;
                } else {
                    /* only 0xA1 - 0xEE are legal after EXT char */
                    *contextCharToUnicode= NO_CHAR_MARKER;
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                goto CALLBACK;
            } else if (*contextCharToUnicode==ISCII_INV) {
                if (sourceChar==ISCII_HALANT) {
                    targetUniChar = 0x0020; /* replace with space accoding to Indic FAQ */
                } else {
                    targetUniChar = ZWJ;
                }

                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                if (data->prevToUnicodeStatus) {
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000;
                }
                /* write to target */
                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;
            }

            /* look at the pre-context and perform special processing */
            switch (sourceChar) {
            case ISCII_INV:
            case EXT:
            case ATR:
                *contextCharToUnicode = (UChar)sourceChar;

                if (*toUnicodeStatus != missingCharMarker) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    *toUnicodeStatus = missingCharMarker;
                }
                continue;
            case ISCII_DANDA:
                /* handle double danda*/
                if (*contextCharToUnicode== ISCII_DANDA) {
                    targetUniChar = DOUBLE_DANDA;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    *toUnicodeStatus = missingCharMarker;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case ISCII_HALANT:
                /* handle explicit halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWNJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case 0x0A:
            case 0x0D:
                data->resetToDefaultToUnicode = TRUE;
                GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_VOWEL_SIGN_E:
                i=1;
                found=FALSE;
                for (; i<vowelSignESpecialCases[0][0]; i++) {
                    U_ASSERT(i<UPRV_LENGTHOF(vowelSignESpecialCases));
                    if (vowelSignESpecialCases[i][0]==(uint8_t)*contextCharToUnicode) {
                        targetUniChar=vowelSignESpecialCases[i][1];
                        found=TRUE;
                        break;
                    }
                }
                if (found) {
                    /* find out if the mapping is valid in this state */
                    if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                        /*targetUniChar += data->currentDeltaToUnicode ;*/
                        *contextCharToUnicode= NO_CHAR_MARKER;
                        *toUnicodeStatus = missingCharMarker;
                        break;
                    }
                }
                GET_MAPPING(sourceChar,targetUniChar,data);
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_NUKTA:
                /* handle soft halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    break;
                } else if (data->currentDeltaToUnicode == PNJ_DELTA && data->contextCharToUnicode == 0xc0) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* We got here because ISCII_NUKTA was preceded by 0xc0 and we are converting Gurmukhi.
                     * In that case we must convert (0xc0 0xe9) to (\u0a5c\u0a4d\u0a39).
                     */
                    targetUniChar = PNJ_RRA;
                    WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                    if (U_SUCCESS(*err)) {
                        targetUniChar = PNJ_SIGN_VIRAMA;
                        WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        if (U_SUCCESS(*err)) {
                            targetUniChar = PNJ_HA;
                            WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        } else {
                            args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                        }
                    } else {
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_SIGN_VIRAMA;
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                    }
                    *toUnicodeStatus = missingCharMarker;
                    data->contextCharToUnicode = NO_CHAR_MARKER;
                    continue;
                } else {
                    /* try to handle <CHAR> + ISCII_NUKTA special mappings */
                    i=1;
                    found =FALSE;
                    for (; i<nuktaSpecialCases[0][0]; i++) {
                        if (nuktaSpecialCases[i][0]==(uint8_t)
                                *contextCharToUnicode) {
                            targetUniChar=nuktaSpecialCases[i][1];
                            found =TRUE;
                            break;
                        }
                    }
                    if (found) {
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            /*targetUniChar += data->currentDeltaToUnicode ;*/
                            *contextCharToUnicode= NO_CHAR_MARKER;
                            *toUnicodeStatus = missingCharMarker;
                            if (data->currentDeltaToUnicode == PNJ_DELTA) {
                                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                                if (data->prevToUnicodeStatus) {
                                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                    data->prevToUnicodeStatus = 0x0000;
                                }
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                                continue;
                            }
                            break;
                        }
                        /* else fall through to default */
                    }
                    /* else fall through to default */
                    U_FALLTHROUGH;
                }
            default:GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;
            }

            if (*toUnicodeStatus != missingCharMarker) {
                /* Check to make sure that consonant clusters are handled correct for Gurmukhi script. */
                if (data->currentDeltaToUnicode == PNJ_DELTA && data->prevToUnicodeStatus != 0 && isPNJConsonant(data->prevToUnicodeStatus) &&
                        (*toUnicodeStatus + PNJ_DELTA) == PNJ_SIGN_VIRAMA && ((UChar32)(targetUniChar + PNJ_DELTA) == data->prevToUnicodeStatus)) {
                    /* Consonant clusters C + HALANT + C should be encoded as ADHAK + C */
                    offset = (int)(source-args->source - 3);
                    tempTargetUniChar = PNJ_ADHAK; /* This is necessary to avoid some compiler warnings. */
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,tempTargetUniChar,0,err);
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000; /* reset the previous unicode code point */
                    *toUnicodeStatus = missingCharMarker;
                    continue;
                } else {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* Check to make sure that Bindi and Tippi are handled correctly for Gurmukhi script. 
                     * If 0xA2 is preceded by a codepoint in the PNJ_BINDI_TIPPI_SET then the target codepoint should be Tippi instead of Bindi.
                     */
                    if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_BINDI && isPNJBindiTippi((*toUnicodeStatus + PNJ_DELTA))) {
                        targetUniChar = PNJ_TIPPI - PNJ_DELTA;
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,PNJ_DELTA,err);
                    } else if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_SIGN_VIRAMA && isPNJConsonant((*toUnicodeStatus + PNJ_DELTA))) {
                        /* Store the current toUnicodeStatus code point for later handling of consonant cluster in Gurmukhi. */
                        data->prevToUnicodeStatus = *toUnicodeStatus + PNJ_DELTA;
                    } else {
                        /* write the previously mapped codepoint */
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    }
                }
                *toUnicodeStatus = missingCharMarker;
            }

            if (targetUniChar != missingCharMarker) {
                /* now save the targetUniChar for delayed write */
                *toUnicodeStatus = (UChar) targetUniChar;
                if (data->resetToDefaultToUnicode==TRUE) {
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                    data->resetToDefaultToUnicode=FALSE;
                }
            } else {

                /* we reach here only if targetUniChar == missingCharMarker
                 * so assign codes to reason and err
                 */
                *err = U_INVALID_CHAR_FOUND;
CALLBACK:
                args->converter->toUBytes[0] = (uint8_t) sourceChar;
                args->converter->toULength = 1;
                break;
            }

        } else {
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    if (U_SUCCESS(*err) && args->flush && source == sourceLimit) {
        /* end of the input stream */
        UConverter *cnv = args->converter;

        if (*contextCharToUnicode==ATR || *contextCharToUnicode==EXT || *contextCharToUnicode==ISCII_INV) {
            /* set toUBytes[] */
            cnv->toUBytes[0] = (uint8_t)*contextCharToUnicode;
            cnv->toULength = 1;

            /* avoid looping on truncated sequences */
            *contextCharToUnicode = NO_CHAR_MARKER;
        } else {
            cnv->toULength = 0;
        }

        if (*toUnicodeStatus != missingCharMarker) {
            /* output a remaining target character */
            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source - args->source -1),*toUnicodeStatus,data->currentDeltaToUnicode,err);
            *toUnicodeStatus = missingCharMarker;
        }
    }

    args->target = target;
    args->source = source;
}